

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O1

FLOAT_STRING_TYPE
splitFloatString(char *nptr,char **endptr,int *signal,double *fraction,int *exponential)

{
  char cVar1;
  byte bVar2;
  byte *nptr_00;
  char *pcVar3;
  int iVar4;
  FLOAT_STRING_TYPE FVar5;
  unsigned_long_long uVar6;
  int *piVar7;
  long lVar8;
  uint uVar9;
  char *pcVar10;
  int iVar11;
  bool bVar12;
  double dVar13;
  undefined1 auVar14 [16];
  unsigned_long_long local_48;
  
  while( true ) {
    *endptr = nptr;
    if ((4 < (byte)*nptr - 9) && (*nptr != 0x20)) break;
    nptr = (char *)((byte *)nptr + 1);
  }
  *signal = 1;
  if (*nptr != 0x2b) {
    if (*nptr != 0x2d) goto LAB_00107783;
    *signal = -1;
  }
  *endptr = (char *)((byte *)nptr + 1);
LAB_00107783:
  pcVar10 = *endptr;
  iVar4 = substricmp(pcVar10,"INF");
  if (iVar4 == 0) {
    *endptr = pcVar10 + 3;
    iVar4 = substricmp(pcVar10 + 3,"INITY");
    if (iVar4 == 0) {
      *endptr = pcVar10 + 8;
    }
    FVar5 = FST_INFINITY;
  }
  else {
    pcVar10 = *endptr;
    iVar4 = substricmp(pcVar10,"NAN");
    if (iVar4 == 0) {
      if (pcVar10[3] == '(') {
        pcVar3 = pcVar10 + 4;
        do {
          pcVar10 = pcVar3;
          cVar1 = *pcVar10;
          if (cVar1 == ')') break;
          pcVar3 = pcVar10 + 1;
        } while (cVar1 != '\0');
        bVar12 = cVar1 == ')';
        if (bVar12) {
          pcVar10 = pcVar10 + 1;
        }
      }
      else {
        bVar12 = true;
        pcVar10 = pcVar10 + 3;
      }
    }
    else {
      bVar12 = false;
    }
    if (bVar12) {
      *endptr = pcVar10;
      FVar5 = FST_NAN;
    }
    else {
      nptr_00 = (byte *)*endptr;
      bVar2 = *nptr_00;
      if ((byte)(bVar2 - 0x30) < 10) {
        uVar9 = bVar2 - 0x30 & 0xff;
      }
      else if ((byte)(bVar2 + 0x9f) < 0x1a) {
        uVar9 = bVar2 - 0x57;
      }
      else {
        uVar9 = 0xffffffff;
        if ((byte)(bVar2 + 0xbf) < 0x1a) {
          uVar9 = bVar2 - 0x37;
        }
      }
      FVar5 = FST_ERROR;
      if (-1 < (int)uVar9) {
        if ((byte)(bVar2 - 0x30) < 10) {
          uVar9 = (uint)(byte)(bVar2 - 0x30);
        }
        else if ((byte)(bVar2 + 0x9f) < 0x1a) {
          uVar9 = bVar2 - 0x57;
        }
        else {
          uVar9 = 0xffffffff;
          if ((byte)(bVar2 + 0xbf) < 0x1a) {
            uVar9 = bVar2 - 0x37;
          }
        }
        if ((int)uVar9 < 10) {
          uVar6 = strtoull_s((char *)nptr_00,endptr,10);
          pcVar10 = *endptr;
          iVar4 = 3;
          if (uVar6 == 0xffffffffffffffff) {
            piVar7 = __errno_location();
            iVar4 = 4 - (uint)(*piVar7 == 0);
          }
          if (*pcVar10 == '.') {
            local_48 = strtoull_s(pcVar10 + 1,endptr,10);
            iVar11 = *(int *)endptr - (int)(pcVar10 + 1);
            if (local_48 == 0xffffffffffffffff) {
              piVar7 = __errno_location();
              if (*piVar7 != 0) {
                iVar4 = 4;
              }
              local_48 = 0xffffffffffffffff;
            }
          }
          else {
            local_48 = 0;
            iVar11 = 0;
          }
          if ((byte)(**endptr | 0x20U) == 0x65) {
            lVar8 = strtol(*endptr + 1,endptr,10);
            *exponential = (int)lVar8;
            if ((int)lVar8 - 0x135U < 0xfffffd97) {
              iVar4 = 4;
            }
          }
          else {
            *exponential = 0;
          }
          FVar5 = FST_OVERFLOW;
          if (iVar4 == 3) {
            iVar4 = (int)pcVar10 - (int)nptr_00;
            dVar13 = pow(10.0,(double)iVar11);
            lVar8 = uVar6 * ((long)(dVar13 - 9.223372036854776e+18) & (long)dVar13 >> 0x3f |
                            (long)dVar13) + local_48;
            auVar14._8_4_ = (int)((ulong)lVar8 >> 0x20);
            auVar14._0_8_ = lVar8;
            auVar14._12_4_ = 0x45300000;
            dVar13 = pow(10.0,(double)iVar4 + (double)iVar11 + -1.0);
            *fraction = ((auVar14._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) / dVar13;
            *exponential = *exponential + iVar4 + -1;
            FVar5 = FST_NUMBER;
          }
        }
      }
    }
  }
  return FVar5;
}

Assistant:

static FLOAT_STRING_TYPE splitFloatString(const char* nptr, char** endptr, int *signal, double *fraction, int *exponential)
{
    FLOAT_STRING_TYPE result = FST_ERROR;

    unsigned long long ullInteger = 0;
    unsigned long long ullFraction = 0;
    int integerSize = 0;
    int fractionSize = 0;
    char* startptr;

    (*endptr) = (char*)nptr;

    /*Codes_SRS_CRT_ABSTRACTIONS_21_018: [The white-space for strtof_s must be one of the characters ' ', '\f', '\n', '\r', '\t', '\v'.]*/
    /*Codes_SRS_CRT_ABSTRACTIONS_21_028: [The white-space for strtold_s must be one of the characters ' ', '\f', '\n', '\r', '\t', '\v'.]*/
    while (IS_SPACE(**endptr))
    {
        (*endptr)++;
    }

    /*Codes_SRS_CRT_ABSTRACTIONS_21_019: [The valid sequence for strtof_s starts after the first non-white - space character, followed by an optional positive or negative sign, a number, 'INF', or 'NAN' (ignoring case).]*/
    /*Codes_SRS_CRT_ABSTRACTIONS_21_029: [The valid sequence for strtold_s starts after the first non-white - space character, followed by an optional positive or negative sign, a number, 'INF', or 'NAN' (ignoring case).]*/
    (*signal) = +1;
    if ((**endptr) == '+')
    {
        (*endptr)++;
    }
    else if ((**endptr) == '-')
    {
        (*signal) = -1;
        (*endptr)++;
    }

    /*Codes_SRS_CRT_ABSTRACTIONS_21_023: [If the string is 'INF' of 'INFINITY' (ignoring case), the strtof_s must return the INFINITY value for float.]*/
    /*Codes_SRS_CRT_ABSTRACTIONS_21_033: [If the string is 'INF' of 'INFINITY' (ignoring case), the strtold_s must return the INFINITY value for long double.]*/
    if (isInfinity((const char**)endptr))
    {
        result = FST_INFINITY;
    }
    /*Codes_SRS_CRT_ABSTRACTIONS_21_034: [If the string is 'NAN' or 'NAN(...)' (ignoring case), the strtold_s must return 0.0 and points endptr to the first character after the 'NAN' sequence.]*/
    /*Codes_SRS_CRT_ABSTRACTIONS_21_024: [If the string is 'NAN' or 'NAN(...)' (ignoring case), the strtof_s must return 0.0f and points endptr to the first character after the 'NAN' sequence.]*/
    else if (isNaN((const char**)endptr))
    {
        result = FST_NAN;
    }
    else if (IN_BASE_RANGE(DIGIT_VAL(**endptr), 10))
    {
        result = FST_NUMBER;
        startptr = *endptr;
        /* integers will go to the fraction and exponential. */
        ullInteger = strtoull_s(startptr, endptr, 10);
        integerSize = (int)((*endptr) - startptr);
        if ((ullInteger == ULLONG_MAX) && (errno != 0))
        {
            result = FST_OVERFLOW;
        }

        /* get the real fraction part, if exist. */
        if ((**endptr) == '.')
        {
            startptr = (*endptr) + 1;
            ullFraction = strtoull_s(startptr, endptr, 10);
            fractionSize = (int)((*endptr) - startptr);
            if ((ullFraction == ULLONG_MAX) && (errno != 0))
            {
                result = FST_OVERFLOW;
            }
        }

        if (((**endptr) == 'e') || ((**endptr) == 'E'))
        {
            startptr = (*endptr) + 1;
            (*exponential) = (int)strtol(startptr, endptr, 10);
            if (((*exponential) < (DBL_MAX_10_EXP * (-1))) || ((*exponential) > DBL_MAX_10_EXP))
            {
                result = FST_OVERFLOW;
            }
        }
        else
        {
            (*exponential) = 0;
        }

        if (result == FST_NUMBER)
        {
            /* Add ullInteger to ullFraction. */
            ullFraction += (ullInteger * (unsigned long long)(pow(10, (double)fractionSize)));
            (*fraction) = ((double)ullFraction / (pow(10.0f, ((double)fractionSize + (double)integerSize - 1.00))));

            /* Unify rest of integerSize and fractionSize in the exponential. */
            (*exponential) += integerSize - 1;
        }
    }

    return result;
}